

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O2

void __thiscall
imrt::EvaluationFunction::update_sorted_voxels
          (EvaluationFunction *this,vector<double,_std::allocator<double>_> *w,
          vector<double,_std::allocator<double>_> *Zmin,
          vector<double,_std::allocator<double>_> *Zmax,int o,int k)

{
  double dVar1;
  long lVar2;
  pair<int,_int> pVar3;
  double dVar4;
  key_type local_40;
  
  lVar2 = (long)k;
  pVar3.second = k;
  pVar3.first = o;
  local_40.first =
       *(double *)
        (*(long *)&(this->D).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[o].
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data + lVar2 * 8);
  local_40.second = pVar3;
  std::
  _Rb_tree<std::pair<double,_std::pair<int,_int>_>,_std::pair<double,_std::pair<int,_int>_>,_std::_Identity<std::pair<double,_std::pair<int,_int>_>_>,_imrt::MagnitudeCompare,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
  ::erase(&(this->voxels)._M_t,&local_40);
  dVar4 = (Zmin->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start[o];
  dVar1 = *(double *)
           (*(long *)&(this->Z).
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[o].
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data + lVar2 * 8);
  if (dVar4 <= 0.0) {
    dVar4 = (Zmax->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[o];
    if (dVar4 < dVar1) goto LAB_0012317e;
  }
  else if (dVar1 < dVar4) {
LAB_0012317e:
    local_40.first =
         ((dVar1 - dVar4) *
         (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
         _M_start[o]) /
         (double)(this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[o];
    *(double *)
     (*(long *)&(this->D).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[o].
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
     + lVar2 * 8) = local_40.first;
    if ((local_40.first == 0.0) && (!NAN(local_40.first))) {
      return;
    }
    local_40.second = pVar3;
    std::
    _Rb_tree<std::pair<double,std::pair<int,int>>,std::pair<double,std::pair<int,int>>,std::_Identity<std::pair<double,std::pair<int,int>>>,imrt::MagnitudeCompare,std::allocator<std::pair<double,std::pair<int,int>>>>
    ::_M_insert_unique<std::pair<double,std::pair<int,int>>>
              ((_Rb_tree<std::pair<double,std::pair<int,int>>,std::pair<double,std::pair<int,int>>,std::_Identity<std::pair<double,std::pair<int,int>>>,imrt::MagnitudeCompare,std::allocator<std::pair<double,std::pair<int,int>>>>
                *)&this->voxels,&local_40);
    return;
  }
  *(undefined8 *)
   (*(long *)&(this->D).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[o].
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data +
   lVar2 * 8) = 0;
  return;
}

Assistant:

void EvaluationFunction::update_sorted_voxels(vector<double>& w,
	vector<double>& Zmin, vector<double>& Zmax, int o, int k){
		voxels.erase(make_pair(D[o][k],make_pair(o,k)));

		if(Zmin[o]>0){
			 if(Z[o][k] < Zmin[o])  D[o][k]=w[o]*(Z[o][k]-Zmin[o])/nb_voxels[o];
			 else D[o][k]=0.0;
		}else{
			if(Z[o][k] > Zmax[o]) D[o][k]=w[o]*(Z[o][k]-Zmax[o])/nb_voxels[o];
			else D[o][k]=0.0;
		}
		if(D[o][k]!=0.0)
			voxels.insert(make_pair(D[o][k],make_pair(o,k)));
}